

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_FlateLzwDecode.cc
# Opt level: O0

Pipeline * __thiscall SF_FlateLzwDecode::getDecodePipeline(SF_FlateLzwDecode *this,Pipeline *next)

{
  element_type *peVar1;
  shared_ptr<Pl_Flate> local_98;
  shared_ptr<Pl_LZWDecoder> local_88;
  uint local_78;
  uint local_74;
  uint local_70 [2];
  shared_ptr<Pl_TIFFPredictor> local_68;
  uint local_58;
  uint local_54;
  uint local_50 [2];
  shared_ptr<Pl_PNGFilter> local_48 [2];
  undefined1 local_28 [8];
  shared_ptr<Pipeline> pipeline;
  Pipeline *next_local;
  SF_FlateLzwDecode *this_local;
  
  pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)next;
  std::shared_ptr<Pipeline>::shared_ptr((shared_ptr<Pipeline> *)local_28);
  if ((this->predictor < 10) || (0xf < this->predictor)) {
    if (this->predictor == 2) {
      QTC::TC("qpdf","SF_FlateLzwDecode TIFF predictor",0);
      local_70[1] = 1;
      local_70[0] = QIntC::to_uint<int>(&this->columns);
      local_74 = QIntC::to_uint<int>(&this->colors);
      local_78 = QIntC::to_uint<int>(&this->bits_per_component);
      std::
      make_shared<Pl_TIFFPredictor,char_const(&)[12],Pipeline*&,Pl_TIFFPredictor::action_e,unsigned_int,unsigned_int,unsigned_int>
                ((char (*) [12])&local_68,(Pipeline **)"tiff decode",
                 (action_e *)
                 &pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 local_70 + 1,local_70,&local_74);
      std::shared_ptr<Pipeline>::operator=((shared_ptr<Pipeline> *)local_28,&local_68);
      std::shared_ptr<Pl_TIFFPredictor>::~shared_ptr(&local_68);
      std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
                (&this->pipelines,(shared_ptr<Pipeline> *)local_28);
      pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *)local_28);
    }
  }
  else {
    QTC::TC("qpdf","SF_FlateLzwDecode PNG filter",0);
    local_50[1] = 1;
    local_50[0] = QIntC::to_uint<int>(&this->columns);
    local_54 = QIntC::to_uint<int>(&this->colors);
    local_58 = QIntC::to_uint<int>(&this->bits_per_component);
    std::
    make_shared<Pl_PNGFilter,char_const(&)[11],Pipeline*&,Pl_PNGFilter::action_e,unsigned_int,unsigned_int,unsigned_int>
              ((char (*) [11])local_48,(Pipeline **)"png decode",
               (action_e *)
               &pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               local_50 + 1,local_50,&local_54);
    std::shared_ptr<Pipeline>::operator=((shared_ptr<Pipeline> *)local_28,local_48);
    std::shared_ptr<Pl_PNGFilter>::~shared_ptr(local_48);
    std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
              (&this->pipelines,(shared_ptr<Pipeline> *)local_28);
    pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  }
  if ((this->lzw & 1U) == 0) {
    std::make_shared<Pl_Flate,char_const(&)[15],Pipeline*&,Pl_Flate::action_e>
              ((char (*) [15])&local_98,(Pipeline **)"stream inflate",
               (action_e *)
               &pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<Pipeline>::operator=((shared_ptr<Pipeline> *)local_28,&local_98);
    std::shared_ptr<Pl_Flate>::~shared_ptr(&local_98);
  }
  else {
    std::make_shared<Pl_LZWDecoder,char_const(&)[11],Pipeline*&,bool&>
              ((char (*) [11])&local_88,(Pipeline **)"lzw decode",
               (bool *)&pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    std::shared_ptr<Pipeline>::operator=((shared_ptr<Pipeline> *)local_28,&local_88);
    std::shared_ptr<Pl_LZWDecoder>::~shared_ptr(&local_88);
  }
  std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
            (&this->pipelines,(value_type *)local_28);
  peVar1 = std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)local_28);
  return peVar1;
}

Assistant:

Pipeline*
SF_FlateLzwDecode::getDecodePipeline(Pipeline* next)
{
    std::shared_ptr<Pipeline> pipeline;
    if (predictor >= 10 && predictor <= 15) {
        QTC::TC("qpdf", "SF_FlateLzwDecode PNG filter");
        pipeline = std::make_shared<Pl_PNGFilter>(
            "png decode",
            next,
            Pl_PNGFilter::a_decode,
            QIntC::to_uint(columns),
            QIntC::to_uint(colors),
            QIntC::to_uint(bits_per_component));
        pipelines.push_back(pipeline);
        next = pipeline.get();
    } else if (predictor == 2) {
        QTC::TC("qpdf", "SF_FlateLzwDecode TIFF predictor");
        pipeline = std::make_shared<Pl_TIFFPredictor>(
            "tiff decode",
            next,
            Pl_TIFFPredictor::a_decode,
            QIntC::to_uint(columns),
            QIntC::to_uint(colors),
            QIntC::to_uint(bits_per_component));
        pipelines.push_back(pipeline);
        next = pipeline.get();
    }

    if (lzw) {
        pipeline = std::make_shared<Pl_LZWDecoder>("lzw decode", next, early_code_change);
    } else {
        pipeline = std::make_shared<Pl_Flate>("stream inflate", next, Pl_Flate::a_inflate);
    }
    pipelines.push_back(pipeline);
    return pipeline.get();
}